

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O3

HAnimHierarchy * rw::HAnimHierarchy::find(Frame *f)

{
  HAnimHierarchy *pHVar1;
  long lVar2;
  
  if (f == (Frame *)0x0) {
    return (HAnimHierarchy *)0x0;
  }
  lVar2 = (long)hAnimOffset;
  while( true ) {
    pHVar1 = *(HAnimHierarchy **)((long)&(f->object).parent + lVar2);
    if (pHVar1 != (HAnimHierarchy *)0x0) {
      return pHVar1;
    }
    pHVar1 = find(f->next);
    if (pHVar1 != (HAnimHierarchy *)0x0) break;
    f = f->child;
    if (f == (Frame *)0x0) {
      return (HAnimHierarchy *)0x0;
    }
  }
  return pHVar1;
}

Assistant:

HAnimHierarchy*
HAnimHierarchy::find(Frame *f)
{
	if(f == nil) return nil;
	HAnimHierarchy *hier = HAnimHierarchy::get(f);
	if(hier) return hier;
	hier = HAnimHierarchy::find(f->next);
	if(hier) return hier;
	return HAnimHierarchy::find(f->child);
}